

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O3

void idx2::Insert<unsigned_long,idx2::chunk_exp_info>
               (iterator *It,unsigned_long *Key,chunk_exp_info *Val)

{
  long lVar1;
  byte bVar2;
  hash_table<unsigned_long,_idx2::chunk_exp_info> *this;
  long lVar3;
  iterator local_30;
  
  *It->Key = *Key;
  memcpy(It->Val,Val,0x90);
  this = It->Ht;
  this->Stats[It->Idx] = Occupied;
  lVar3 = this->Size;
  lVar1 = lVar3 + 1;
  this->Size = lVar1;
  bVar2 = (byte)this->LogCapacity;
  if (7L << (bVar2 & 0x3f) <= (lVar3 * 2 + 2) * 5) {
    IncreaseCapacity<unsigned_long,idx2::chunk_exp_info>
              (&local_30,(idx2 *)this,(hash_table<unsigned_long,_idx2::chunk_exp_info> *)It,
               (iterator *)CONCAT71((int7)((ulong)lVar1 >> 8),bVar2));
    It->Key = local_30.Key;
    It->Val = local_30.Val;
    It->Ht = local_30.Ht;
    It->Idx = local_30.Idx;
  }
  return;
}

Assistant:

void
Insert(typename hash_table<k, v>::iterator* It, const k& Key, const v& Val)
{
  idx2_Assert((*It) != End(*(It->Ht)));
  *(It->Key) = Key;
  *(It->Val) = Val;
  It->Ht->Stats[It->Idx] = hash_table<k, v>::Occupied;
  ++It->Ht->Size;

  if (Size(*(It->Ht)) * 10 >= Capacity(*(It->Ht)) * 7)
  {
    *(It) = IncreaseCapacity(It->Ht, *It);
  }
}